

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_suite.cpp
# Opt level: O1

void buffer_suite::format_vector(void)

{
  vector<char,_std::allocator<char>_> result;
  variable data;
  long local_60;
  vector<char,_std::allocator<char>_> local_58;
  undefined4 local_3c;
  type local_38;
  undefined1 local_18;
  
  local_18 = 1;
  local_38.__data[0] = '\x01';
  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  trial::protocol::json::format<std::vector<char,std::allocator<char>>,std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)&local_38.__align,&local_58);
  local_60 = (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  local_3c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("result.size()","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/format_suite.cpp"
             ,0x2f,"void buffer_suite::format_vector()",&local_60,&local_3c);
  local_60._0_1_ = 0x74;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,char,char>
            ("result[0]","\'t\'",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/format_suite.cpp"
             ,0x30,"void buffer_suite::format_vector()",
             local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,&local_60);
  local_60._0_1_ = 0x72;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,char,char>
            ("result[1]","\'r\'",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/format_suite.cpp"
             ,0x31,"void buffer_suite::format_vector()",
             local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + 1,&local_60);
  local_60._0_1_ = 0x75;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,char,char>
            ("result[2]","\'u\'",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/format_suite.cpp"
             ,0x32,"void buffer_suite::format_vector()",
             local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + 2,&local_60);
  local_60 = CONCAT71(local_60._1_7_,0x65);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,char,char>
            ("result[3]","\'e\'",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/format_suite.cpp"
             ,0x33,"void buffer_suite::format_vector()",
             local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + 3,&local_60);
  if (local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_38.__align);
  return;
}

Assistant:

void format_vector()
{
    variable data(true);
    std::vector<char> result;
    json::format(data, result);
    TRIAL_PROTOCOL_TEST_EQUAL(result.size(), 4);
    TRIAL_PROTOCOL_TEST_EQUAL(result[0], 't');
    TRIAL_PROTOCOL_TEST_EQUAL(result[1], 'r');
    TRIAL_PROTOCOL_TEST_EQUAL(result[2], 'u');
    TRIAL_PROTOCOL_TEST_EQUAL(result[3], 'e');
}